

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::addImageProcessing2QCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,bool isForGather)

{
  Op OVar1;
  Id IVar2;
  bool isInterfaceObject;
  anon_class_8_1_8991fb9c aStack_20;
  Id opc;
  anon_class_8_1_8991fb9c addDecor;
  bool isForGather_local;
  Id id_local;
  TGlslangToSpvTraverser *this_local;
  
  addDecor.this._3_1_ = isForGather;
  addDecor.this._4_4_ = id;
  if (isForGather) {
    addImageProcessingQCOMDecoration(this,id,BlockMatchTextureQCOM);
  }
  else {
    aStack_20.this = this;
    OVar1 = spv::Builder::getOpCode(&this->builder,id);
    if (OVar1 == OpSampledImage) {
      IVar2 = spv::Builder::getIdOperand(&this->builder,addDecor.this._4_4_,0);
      addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
                (&stack0xffffffffffffffe0,IVar2,BlockMatchTextureQCOM);
      IVar2 = spv::Builder::getIdOperand(&this->builder,addDecor.this._4_4_,1);
      addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
                (&stack0xffffffffffffffe0,IVar2,BlockMatchSamplerQCOM);
    }
    else {
      addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
                (&stack0xffffffffffffffe0,addDecor.this._4_4_,BlockMatchTextureQCOM);
      addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
                (&stack0xffffffffffffffe0,addDecor.this._4_4_,BlockMatchSamplerQCOM);
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessing2QCOMDecoration(spv::Id id, bool isForGather)
{
  if (isForGather) {
    return addImageProcessingQCOMDecoration(id, spv::DecorationBlockMatchTextureQCOM);
  }

  auto addDecor =
    [this](spv::Id id, spv::Decoration decor) {
      spv::Id tsopc = this->builder.getOpCode(id);
      if (tsopc == spv::OpLoad) {
        spv::Id tsid = this->builder.getIdOperand(id, 0);
        if (this->glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4) {
          assert(iOSet.count(tsid) > 0);
        }
        if (!hasQCOMImageProceessingDecoration(tsid, decor)) {
          this->builder.addDecoration(tsid, decor);
          idToQCOMDecorations[tsid].push_back(decor);
        }
      }
    };

  spv::Id opc = builder.getOpCode(id);
  bool isInterfaceObject = (opc != spv::OpSampledImage);

  if (!isInterfaceObject) {
    addDecor(builder.getIdOperand(id, 0), spv::DecorationBlockMatchTextureQCOM);
    addDecor(builder.getIdOperand(id, 1), spv::DecorationBlockMatchSamplerQCOM);
  } else {
    addDecor(id, spv::DecorationBlockMatchTextureQCOM);
    addDecor(id, spv::DecorationBlockMatchSamplerQCOM);
  }
}